

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspif_text.cpp
# Opt level: O2

void __thiscall Potassco::AspifTextInput::matchLits(AspifTextInput *this)

{
  Data *this_00;
  byte bVar1;
  bool bVar2;
  int iVar3;
  Lit_t lit;
  
  bVar1 = ProgramReader::peek(&this->super_ProgramReader,true);
  iVar3 = islower((uint)bVar1);
  if (iVar3 != 0) {
    do {
      this_00 = this->data_;
      lit = matchLit(this);
      RuleBuilder::addGoal(&this_00->rule,lit);
      bVar2 = match(this,",",false);
    } while (bVar2);
  }
  return;
}

Assistant:

void AspifTextInput::matchLits() {
	if (std::islower(static_cast<unsigned char>(peek(true))) != 0) {
		do {
			data_->rule.addGoal(matchLit());
		} while (match(",", false));
	}
}